

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddLibraryCommand.cxx
# Opt level: O0

bool __thiscall
cmAddLibraryCommand::InitialPass
          (cmAddLibraryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer *msg_00;
  cmMakefile *pcVar1;
  bool bVar2;
  string *__first;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  PolicyStatus PVar6;
  TargetType TVar7;
  uint uVar8;
  char *pcVar9;
  reference input;
  reference pbVar10;
  long lVar11;
  ostream *poVar12;
  size_type sVar13;
  cmTarget *pcVar14;
  cmState *this_00;
  cmGlobalGenerator *pcVar15;
  const_reference pvVar16;
  const_iterator __last;
  PolicyID id;
  char *local_2a28;
  byte local_29f1;
  byte local_2899;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2828;
  const_iterator local_2820;
  allocator local_2811;
  string local_2810 [8];
  string msg_1;
  string local_27e8;
  undefined1 local_27c8 [8];
  ostringstream e_21;
  undefined1 local_2650 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srclists;
  string msg;
  string local_2610;
  string local_25f0;
  ostringstream local_25d0 [8];
  ostringstream e_20;
  string local_2458;
  ostringstream local_2438 [8];
  ostringstream e_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22a0;
  undefined1 local_2280 [8];
  string reason;
  string local_2258;
  string local_2238;
  ostringstream local_2218 [8];
  ostringstream w;
  allocator local_2099;
  string local_2098;
  allocator local_2071;
  string local_2070;
  allocator local_2049;
  string local_2048;
  string local_2028;
  ostringstream local_2008 [8];
  ostringstream e_18;
  string local_1e90;
  ostringstream local_1e70 [8];
  ostringstream e_17;
  undefined1 local_1cf0 [4];
  TargetType aliasedType;
  ostringstream local_1cd0 [8];
  ostringstream e_16;
  allocator local_1b51;
  string local_1b50;
  cmTarget *local_1b30;
  cmTarget *aliasedTarget;
  ostringstream local_1b08 [8];
  ostringstream e_15;
  allocator local_1989;
  string local_1988;
  char *local_1968;
  char *aliasedName;
  ostringstream local_1940 [8];
  ostringstream e_14;
  allocator local_17c1;
  string local_17c0;
  allocator local_1799;
  string local_1798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1778;
  string local_1758;
  string local_1738;
  byte local_1711;
  undefined1 local_1710 [7];
  bool issueMessage;
  ostringstream e_13;
  MessageType local_1598;
  bool local_1591;
  MessageType messageType;
  bool nameOk;
  ostringstream local_1570 [8];
  ostringstream e_12;
  string local_13f8;
  ostringstream local_13d8 [8];
  ostringstream e_11;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1260;
  string local_1258;
  undefined1 local_1238 [8];
  ostringstream e_10;
  string local_10c0;
  undefined1 local_10a0 [8];
  ostringstream e_9;
  string local_f28;
  undefined1 local_f08 [8];
  ostringstream e_8;
  string local_d90;
  undefined1 local_d70 [8];
  ostringstream e_7;
  string local_bf8;
  undefined1 local_bd8 [8];
  ostringstream e_6;
  string local_a60;
  undefined1 local_a40 [8];
  ostringstream e_5;
  string local_8c8;
  undefined1 local_8a8 [8];
  ostringstream e_4;
  string local_730;
  undefined1 local_710 [8];
  ostringstream e_3;
  string local_598;
  undefined1 local_578 [8];
  ostringstream e_2;
  string local_400;
  undefined1 local_3e0 [8];
  ostringstream e_1;
  int local_264;
  string local_260;
  undefined1 local_240 [8];
  ostringstream e;
  undefined1 local_c8 [8];
  string libType;
  bool isAlias;
  bool haveSpecifiedType;
  string *libName;
  const_iterator s;
  undefined1 local_80 [4];
  bool importGlobal;
  bool importTarget;
  bool excludeFromAll;
  TargetType local_60;
  TargetType type;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmAddLibraryCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_00756a7c;
  }
  local_60 = SHARED_LIBRARY;
  pcVar1 = (this->super_cmCommand).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_80,"BUILD_SHARED_LIBS",(allocator *)((long)&s._M_current + 7));
  pcVar9 = cmMakefile::GetDefinition(pcVar1,(string *)local_80);
  bVar3 = cmSystemTools::IsOff(pcVar9);
  std::__cxx11::string::~string((string *)local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&s._M_current + 7));
  if (bVar3) {
    local_60 = STATIC_LIBRARY;
  }
  s._M_current._6_1_ = 0;
  s._M_current._5_1_ = 0;
  s._M_current._4_1_ = 0;
  libName = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)param_2_local);
  input = __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&libName);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&libName);
  bVar3 = false;
  bVar2 = false;
  do {
    libType.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)param_2_local);
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&libName,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&libType.field_2 + 8));
    if (!bVar4) goto LAB_00754fcb;
    pbVar10 = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&libName);
    std::__cxx11::string::string((string *)local_c8,(string *)pbVar10);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_c8,"STATIC");
    if (bVar4) {
      if (local_60 != INTERFACE_LIBRARY) {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&libName);
        local_60 = STATIC_LIBRARY;
        bVar3 = true;
        goto LAB_00754f7a;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
      std::operator<<((ostream *)local_240,
                      "INTERFACE library specified with conflicting STATIC type.");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      this_local._7_1_ = 0;
      local_264 = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_240);
    }
    else {
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_c8,"SHARED");
      if (bVar4) {
        if (local_60 != INTERFACE_LIBRARY) {
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&libName);
          local_60 = SHARED_LIBRARY;
          bVar3 = true;
          goto LAB_00754f7a;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
        std::operator<<((ostream *)local_3e0,
                        "INTERFACE library specified with conflicting SHARED type.");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,&local_400);
        std::__cxx11::string::~string((string *)&local_400);
        this_local._7_1_ = 0;
        local_264 = 1;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e0);
      }
      else {
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_c8,"MODULE");
        if (bVar4) {
          if (local_60 != INTERFACE_LIBRARY) {
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&libName);
            local_60 = MODULE_LIBRARY;
            bVar3 = true;
            goto LAB_00754f7a;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_578);
          std::operator<<((ostream *)local_578,
                          "INTERFACE library specified with conflicting MODULE type.");
          std::__cxx11::ostringstream::str();
          cmCommand::SetError(&this->super_cmCommand,&local_598);
          std::__cxx11::string::~string((string *)&local_598);
          this_local._7_1_ = 0;
          local_264 = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_578);
        }
        else {
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_c8,"OBJECT");
          if (bVar4) {
            if (local_60 != INTERFACE_LIBRARY) {
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&libName);
              local_60 = OBJECT_LIBRARY;
              bVar3 = true;
              goto LAB_00754f7a;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_710);
            std::operator<<((ostream *)local_710,
                            "INTERFACE library specified with conflicting OBJECT type.");
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,&local_730);
            std::__cxx11::string::~string((string *)&local_730);
            this_local._7_1_ = 0;
            local_264 = 1;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_710);
          }
          else {
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_c8,"UNKNOWN");
            if (bVar4) {
              if (local_60 != INTERFACE_LIBRARY) {
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&libName);
                local_60 = UNKNOWN_LIBRARY;
                bVar3 = true;
                goto LAB_00754f7a;
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8a8);
              std::operator<<((ostream *)local_8a8,
                              "INTERFACE library specified with conflicting UNKNOWN type.");
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,&local_8c8);
              std::__cxx11::string::~string((string *)&local_8c8);
              this_local._7_1_ = 0;
              local_264 = 1;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8a8);
            }
            else {
              bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_c8,"ALIAS");
              if (bVar4) {
                if (local_60 != INTERFACE_LIBRARY) {
                  __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&libName);
                  bVar2 = true;
                  goto LAB_00754f7a;
                }
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a40);
                std::operator<<((ostream *)local_a40,
                                "INTERFACE library specified with conflicting ALIAS type.");
                std::__cxx11::ostringstream::str();
                cmCommand::SetError(&this->super_cmCommand,&local_a60);
                std::__cxx11::string::~string((string *)&local_a60);
                this_local._7_1_ = 0;
                local_264 = 1;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a40);
              }
              else {
                bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_c8,"INTERFACE");
                if (bVar4) {
                  if (bVar3) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_bd8);
                    std::operator<<((ostream *)local_bd8,
                                    "INTERFACE library specified with conflicting/multiple types.");
                    std::__cxx11::ostringstream::str();
                    cmCommand::SetError(&this->super_cmCommand,&local_bf8);
                    std::__cxx11::string::~string((string *)&local_bf8);
                    this_local._7_1_ = 0;
                    local_264 = 1;
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_bd8);
                  }
                  else if (bVar2) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d70);
                    std::operator<<((ostream *)local_d70,
                                    "INTERFACE library specified with conflicting ALIAS type.");
                    std::__cxx11::ostringstream::str();
                    cmCommand::SetError(&this->super_cmCommand,&local_d90);
                    std::__cxx11::string::~string((string *)&local_d90);
                    this_local._7_1_ = 0;
                    local_264 = 1;
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d70);
                  }
                  else {
                    if ((s._M_current._6_1_ & 1) == 0) {
                      __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&libName);
                      local_60 = INTERFACE_LIBRARY;
                      bVar3 = true;
                      goto LAB_00754f7a;
                    }
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f08);
                    std::operator<<((ostream *)local_f08,
                                    "INTERFACE library may not be used with EXCLUDE_FROM_ALL.");
                    std::__cxx11::ostringstream::str();
                    cmCommand::SetError(&this->super_cmCommand,&local_f28);
                    std::__cxx11::string::~string((string *)&local_f28);
                    this_local._7_1_ = 0;
                    local_264 = 1;
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f08);
                  }
                }
                else {
                  pbVar10 = __gnu_cxx::
                            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&libName);
                  bVar4 = std::operator==(pbVar10,"EXCLUDE_FROM_ALL");
                  if (bVar4) {
                    if (local_60 != INTERFACE_LIBRARY) {
                      __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&libName);
                      s._M_current._6_1_ = 1;
                      goto LAB_00754f7a;
                    }
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_10a0);
                    std::operator<<((ostream *)local_10a0,
                                    "INTERFACE library may not be used with EXCLUDE_FROM_ALL.");
                    std::__cxx11::ostringstream::str();
                    cmCommand::SetError(&this->super_cmCommand,&local_10c0);
                    std::__cxx11::string::~string((string *)&local_10c0);
                    this_local._7_1_ = 0;
                    local_264 = 1;
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_10a0);
                  }
                  else {
                    pbVar10 = __gnu_cxx::
                              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&libName);
                    bVar4 = std::operator==(pbVar10,"IMPORTED");
                    if (bVar4) {
                      __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&libName);
                      s._M_current._5_1_ = 1;
LAB_00754f7a:
                      local_264 = 0;
                    }
                    else {
                      if ((s._M_current._5_1_ & 1) != 0) {
                        pbVar10 = __gnu_cxx::
                                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&libName);
                        bVar4 = std::operator==(pbVar10,"GLOBAL");
                        if (bVar4) {
                          __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)&libName);
                          s._M_current._4_1_ = 1;
                          goto LAB_00754f7a;
                        }
                      }
                      if (local_60 == INTERFACE_LIBRARY) {
                        pbVar10 = __gnu_cxx::
                                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&libName);
                        bVar4 = std::operator==(pbVar10,"GLOBAL");
                        if (bVar4) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1238);
                          std::operator<<((ostream *)local_1238,
                                          "GLOBAL option may only be used with IMPORTED libraries.")
                          ;
                          std::__cxx11::ostringstream::str();
                          cmCommand::SetError(&this->super_cmCommand,&local_1258);
                          std::__cxx11::string::~string((string *)&local_1258);
                          this_local._7_1_ = 0;
                          local_264 = 1;
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1238);
                          goto LAB_00754f84;
                        }
                      }
                      local_264 = 3;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_00754f84:
    std::__cxx11::string::~string((string *)local_c8);
  } while (local_264 == 0);
  if (local_264 == 1) goto LAB_00756a7c;
LAB_00754fcb:
  if (local_60 == INTERFACE_LIBRARY) {
    local_1260._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)param_2_local);
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&libName,&local_1260);
    if (bVar4) {
      std::__cxx11::ostringstream::ostringstream(local_13d8);
      std::operator<<((ostream *)local_13d8,"INTERFACE library requires no source arguments.");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_13f8);
      std::__cxx11::string::~string((string *)&local_13f8);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_13d8);
      goto LAB_00756a7c;
    }
    if (((s._M_current._4_1_ & 1) != 0) && ((s._M_current._5_1_ & 1) == 0)) {
      std::__cxx11::ostringstream::ostringstream(local_1570);
      std::operator<<((ostream *)local_1570,
                      "INTERFACE library specified as GLOBAL, but not as IMPORTED.");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,(string *)&messageType);
      std::__cxx11::string::~string((string *)&messageType);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1570);
      goto LAB_00756a7c;
    }
  }
  bVar4 = cmGeneratorExpression::IsValidTargetName(input);
  local_2899 = 0;
  if (bVar4) {
    bVar4 = cmGlobalGenerator::IsReservedTarget(input);
    local_2899 = bVar4 ^ 0xff;
  }
  local_1591 = (bool)(local_2899 & 1);
  if (((local_1591 != false) && ((s._M_current._5_1_ & 1) == 0)) && (!bVar2)) {
    lVar11 = std::__cxx11::string::find((char)input,0x3a);
    local_1591 = lVar11 == -1;
  }
  if (local_1591 == false) {
    local_1598 = AUTHOR_WARNING;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1710);
    local_1711 = 0;
    PVar6 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0037);
    if (PVar6 != OLD) {
      if (PVar6 == WARN) {
        if (local_60 != INTERFACE_LIBRARY) {
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1738,(cmPolicies *)0x25,id);
          poVar12 = std::operator<<((ostream *)local_1710,(string *)&local_1738);
          std::operator<<(poVar12,"\n");
          std::__cxx11::string::~string((string *)&local_1738);
          local_1711 = 1;
        }
      }
      else if (PVar6 - NEW < 3) {
        local_1711 = 1;
        local_1598 = FATAL_ERROR;
      }
    }
    if ((local_1711 & 1) == 0) {
LAB_00755400:
      bVar4 = false;
    }
    else {
      poVar12 = std::operator<<((ostream *)local_1710,"The target name \"");
      poVar12 = std::operator<<(poVar12,(string *)input);
      std::operator<<(poVar12,
                      "\" is reserved or not valid for certain CMake features, such as generator expressions, and may result in undefined behavior."
                     );
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,local_1598,&local_1758);
      std::__cxx11::string::~string((string *)&local_1758);
      if (local_1598 != FATAL_ERROR) goto LAB_00755400;
      this_local._7_1_ = 0;
      bVar4 = true;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1710);
    if (bVar4) goto LAB_00756a7c;
  }
  if (bVar2) {
    bVar3 = cmGeneratorExpression::IsValidTargetName(input);
    if (bVar3) {
      if ((s._M_current._6_1_ & 1) == 0) {
        if (((s._M_current._5_1_ & 1) == 0) && ((s._M_current._4_1_ & 1) == 0)) {
          sVar13 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local);
          if (sVar13 == 3) {
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator->((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&libName);
            pcVar9 = (char *)std::__cxx11::string::c_str();
            pcVar1 = (this->super_cmCommand).Makefile;
            local_1968 = pcVar9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1988,pcVar9,&local_1989);
            bVar3 = cmMakefile::IsAlias(pcVar1,&local_1988);
            std::__cxx11::string::~string((string *)&local_1988);
            std::allocator<char>::~allocator((allocator<char> *)&local_1989);
            pcVar9 = local_1968;
            if (bVar3) {
              std::__cxx11::ostringstream::ostringstream(local_1b08);
              poVar12 = std::operator<<((ostream *)local_1b08,"cannot create ALIAS target \"");
              poVar12 = std::operator<<(poVar12,(string *)input);
              poVar12 = std::operator<<(poVar12,"\" because target \"");
              poVar12 = std::operator<<(poVar12,local_1968);
              std::operator<<(poVar12,"\" is itself an ALIAS.");
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,(string *)&aliasedTarget);
              std::__cxx11::string::~string((string *)&aliasedTarget);
              this_local._7_1_ = 0;
              std::__cxx11::ostringstream::~ostringstream(local_1b08);
            }
            else {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_1b50,pcVar9,&local_1b51);
              pcVar14 = cmMakefile::FindTargetToUse(pcVar1,&local_1b50,true);
              std::__cxx11::string::~string((string *)&local_1b50);
              std::allocator<char>::~allocator((allocator<char> *)&local_1b51);
              local_1b30 = pcVar14;
              if (pcVar14 == (cmTarget *)0x0) {
                std::__cxx11::ostringstream::ostringstream(local_1cd0);
                poVar12 = std::operator<<((ostream *)local_1cd0,"cannot create ALIAS target \"");
                poVar12 = std::operator<<(poVar12,(string *)input);
                poVar12 = std::operator<<(poVar12,"\" because target \"");
                poVar12 = std::operator<<(poVar12,local_1968);
                std::operator<<(poVar12,"\" does not already exist.");
                std::__cxx11::ostringstream::str();
                cmCommand::SetError(&this->super_cmCommand,(string *)local_1cf0);
                std::__cxx11::string::~string((string *)local_1cf0);
                this_local._7_1_ = 0;
                std::__cxx11::ostringstream::~ostringstream(local_1cd0);
              }
              else {
                TVar7 = cmTarget::GetType(pcVar14);
                if (((TVar7 == SHARED_LIBRARY) || (TVar7 == STATIC_LIBRARY)) ||
                   ((TVar7 == MODULE_LIBRARY ||
                    ((TVar7 == OBJECT_LIBRARY || (TVar7 == INTERFACE_LIBRARY)))))) {
                  bVar3 = cmTarget::IsImported(local_1b30);
                  pcVar9 = local_1968;
                  if (bVar3) {
                    std::__cxx11::ostringstream::ostringstream(local_2008);
                    poVar12 = std::operator<<((ostream *)local_2008,"cannot create ALIAS target \"")
                    ;
                    poVar12 = std::operator<<(poVar12,(string *)input);
                    poVar12 = std::operator<<(poVar12,"\" because target \"");
                    poVar12 = std::operator<<(poVar12,local_1968);
                    std::operator<<(poVar12,"\" is IMPORTED.");
                    std::__cxx11::ostringstream::str();
                    cmCommand::SetError(&this->super_cmCommand,&local_2028);
                    std::__cxx11::string::~string((string *)&local_2028);
                    this_local._7_1_ = 0;
                    std::__cxx11::ostringstream::~ostringstream(local_2008);
                  }
                  else {
                    pcVar1 = (this->super_cmCommand).Makefile;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)&local_2048,pcVar9,&local_2049);
                    cmMakefile::AddAlias(pcVar1,input,&local_2048);
                    std::__cxx11::string::~string((string *)&local_2048);
                    std::allocator<char>::~allocator((allocator<char> *)&local_2049);
                    this_local._7_1_ = 1;
                  }
                }
                else {
                  std::__cxx11::ostringstream::ostringstream(local_1e70);
                  poVar12 = std::operator<<((ostream *)local_1e70,"cannot create ALIAS target \"");
                  poVar12 = std::operator<<(poVar12,(string *)input);
                  poVar12 = std::operator<<(poVar12,"\" because target \"");
                  poVar12 = std::operator<<(poVar12,local_1968);
                  std::operator<<(poVar12,"\" is not a library.");
                  std::__cxx11::ostringstream::str();
                  cmCommand::SetError(&this->super_cmCommand,&local_1e90);
                  std::__cxx11::string::~string((string *)&local_1e90);
                  this_local._7_1_ = 0;
                  std::__cxx11::ostringstream::~ostringstream(local_1e70);
                }
              }
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream(local_1940);
            std::operator<<((ostream *)local_1940,"ALIAS requires exactly one target argument.");
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)&aliasedName);
            std::__cxx11::string::~string((string *)&aliasedName);
            this_local._7_1_ = 0;
            std::__cxx11::ostringstream::~ostringstream(local_1940);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_17c0,"IMPORTED with ALIAS is not allowed.",&local_17c1);
          cmCommand::SetError(&this->super_cmCommand,&local_17c0);
          std::__cxx11::string::~string((string *)&local_17c0);
          std::allocator<char>::~allocator((allocator<char> *)&local_17c1);
          this_local._7_1_ = 0;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1798,"EXCLUDE_FROM_ALL with ALIAS makes no sense.",&local_1799);
        cmCommand::SetError(&this->super_cmCommand,&local_1798);
        std::__cxx11::string::~string((string *)&local_1798);
        std::allocator<char>::~allocator((allocator<char> *)&local_1799);
        this_local._7_1_ = 0;
      }
    }
    else {
      std::operator+(&local_1778,"Invalid name for ALIAS: ",input);
      cmCommand::SetError(&this->super_cmCommand,&local_1778);
      std::__cxx11::string::~string((string *)&local_1778);
      this_local._7_1_ = 0;
    }
  }
  else if (((s._M_current._5_1_ & 1) == 0) || ((s._M_current._6_1_ & 1) == 0)) {
    bVar4 = false;
    bVar2 = false;
    if ((local_60 == SHARED_LIBRARY) || (local_29f1 = 0, local_60 == MODULE_LIBRARY)) {
      this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
      std::allocator<char>::allocator();
      bVar4 = true;
      std::__cxx11::string::string((string *)&local_2098,"TARGET_SUPPORTS_SHARED_LIBS",&local_2099);
      bVar2 = true;
      bVar5 = cmState::GetGlobalPropertyAsBool(this_00,&local_2098);
      local_29f1 = bVar5 ^ 0xff;
    }
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_2098);
    }
    if (bVar4) {
      std::allocator<char>::~allocator((allocator<char> *)&local_2099);
    }
    if ((local_29f1 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_2218);
      poVar12 = std::operator<<((ostream *)local_2218,"ADD_LIBRARY called with ");
      if (local_60 == SHARED_LIBRARY) {
        local_2a28 = "SHARED";
      }
      else {
        local_2a28 = "MODULE";
      }
      poVar12 = std::operator<<(poVar12,local_2a28);
      std::operator<<(poVar12,
                      " option but the target platform does not support dynamic linking. Building a STATIC library instead. This may lead to problems."
                     );
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_2238);
      std::__cxx11::string::~string((string *)&local_2238);
      local_60 = STATIC_LIBRARY;
      std::__cxx11::ostringstream::~ostringstream(local_2218);
    }
    if ((s._M_current._5_1_ & 1) == 0) {
      if (local_60 == UNKNOWN_LIBRARY) {
        pcVar1 = (this->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_2610,
                   "The UNKNOWN library type may be used only for IMPORTED libraries.",
                   (allocator *)(msg.field_2._M_local_buf + 0xf));
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_2610);
        std::__cxx11::string::~string((string *)&local_2610);
        std::allocator<char>::~allocator((allocator<char> *)(msg.field_2._M_local_buf + 0xf));
        this_local._7_1_ = 1;
      }
      else {
        msg_00 = &srclists.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::string((string *)msg_00);
        bVar3 = cmMakefile::EnforceUniqueName
                          ((this->super_cmCommand).Makefile,input,(string *)msg_00,false);
        if (!bVar3) {
          cmCommand::SetError(&this->super_cmCommand,
                              (string *)
                              &srclists.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          this_local._7_1_ = 0;
        }
        std::__cxx11::string::~string
                  ((string *)
                   &srclists.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar3) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2650);
          if (local_60 == INTERFACE_LIBRARY) {
            bVar3 = cmGeneratorExpression::IsValidTargetName(input);
            if ((bVar3) &&
               (lVar11 = std::__cxx11::string::find((char *)input,0xb9988c), lVar11 == -1)) {
              cmMakefile::AddLibrary
                        ((this->super_cmCommand).Makefile,input,local_60,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2650,(bool)(s._M_current._6_1_ & 1));
              this_local._7_1_ = 1;
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_27c8);
              poVar12 = std::operator<<((ostream *)local_27c8,
                                        "Invalid name for INTERFACE library target: ");
              std::operator<<(poVar12,(string *)input);
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,&local_27e8);
              std::__cxx11::string::~string((string *)&local_27e8);
              this_local._7_1_ = 0;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_27c8);
            }
          }
          else {
            msg_1.field_2._8_8_ =
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_2_local);
            bVar3 = __gnu_cxx::operator==
                              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&libName,
                               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&msg_1.field_2 + 8));
            if (bVar3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_2810,"You have called ADD_LIBRARY for library ",&local_2811);
              std::allocator<char>::~allocator((allocator<char> *)&local_2811);
              pvVar16 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)param_2_local,0);
              std::__cxx11::string::operator+=(local_2810,(string *)pvVar16);
              std::__cxx11::string::operator+=
                        (local_2810," without any source files. This typically indicates a problem "
                        );
              std::__cxx11::string::operator+=(local_2810,"with your CMakeLists.txt file");
              pcVar9 = (char *)std::__cxx11::string::c_str();
              cmSystemTools::Message(pcVar9,"Warning");
              std::__cxx11::string::~string(local_2810);
            }
            local_2828._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_2650);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ::__normal_iterator<std::__cxx11::string*>
                      ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        *)&local_2820,&local_2828);
            __first = libName;
            __last = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)param_2_local);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       local_2650,local_2820,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )__first,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )__last._M_current);
            cmMakefile::AddLibrary
                      ((this->super_cmCommand).Makefile,input,local_60,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_2650,(bool)(s._M_current._6_1_ & 1));
            this_local._7_1_ = 1;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_2650);
        }
      }
    }
    else if (bVar3) {
      if (local_60 == OBJECT_LIBRARY) {
        std::__cxx11::string::string((string *)local_2280);
        pcVar15 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
        uVar8 = (*pcVar15->_vptr_cmGlobalGenerator[0x20])(pcVar15,local_2280);
        bVar3 = (uVar8 & 1) == 0;
        if (bVar3) {
          pcVar1 = (this->super_cmCommand).Makefile;
          std::operator+(&local_22c0,
                         "The OBJECT library type may not be used for IMPORTED libraries",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2280);
          std::operator+(&local_22a0,&local_22c0,".");
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_22a0);
          std::__cxx11::string::~string((string *)&local_22a0);
          std::__cxx11::string::~string((string *)&local_22c0);
          this_local._7_1_ = 1;
        }
        std::__cxx11::string::~string((string *)local_2280);
        if (bVar3) goto LAB_00756a7c;
      }
      if ((local_60 != INTERFACE_LIBRARY) ||
         (bVar3 = cmGeneratorExpression::IsValidTargetName(input), bVar3)) {
        pcVar14 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,input,false);
        if (pcVar14 == (cmTarget *)0x0) {
          cmMakefile::AddImportedTarget
                    ((this->super_cmCommand).Makefile,input,local_60,(bool)(s._M_current._4_1_ & 1))
          ;
          this_local._7_1_ = 1;
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_25d0);
          poVar12 = std::operator<<((ostream *)local_25d0,"cannot create imported target \"");
          poVar12 = std::operator<<(poVar12,(string *)input);
          std::operator<<(poVar12,"\" because another target with the same name already exists.");
          std::__cxx11::ostringstream::str();
          cmCommand::SetError(&this->super_cmCommand,&local_25f0);
          std::__cxx11::string::~string((string *)&local_25f0);
          this_local._7_1_ = 0;
          std::__cxx11::ostringstream::~ostringstream(local_25d0);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_2438);
        poVar12 = std::operator<<((ostream *)local_2438,
                                  "Invalid name for IMPORTED INTERFACE library target: ");
        std::operator<<(poVar12,(string *)input);
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,&local_2458);
        std::__cxx11::string::~string((string *)&local_2458);
        this_local._7_1_ = 0;
        std::__cxx11::ostringstream::~ostringstream(local_2438);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2258,"called with IMPORTED argument but no library type.",
                 (allocator *)(reason.field_2._M_local_buf + 0xf));
      cmCommand::SetError(&this->super_cmCommand,&local_2258);
      std::__cxx11::string::~string((string *)&local_2258);
      std::allocator<char>::~allocator((allocator<char> *)(reason.field_2._M_local_buf + 0xf));
      this_local._7_1_ = 0;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2070,"excludeFromAll with IMPORTED target makes no sense.",
               &local_2071);
    cmCommand::SetError(&this->super_cmCommand,&local_2070);
    std::__cxx11::string::~string((string *)&local_2070);
    std::allocator<char>::~allocator((allocator<char> *)&local_2071);
    this_local._7_1_ = 0;
  }
LAB_00756a7c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmAddLibraryCommand::InitialPass(std::vector<std::string> const& args,
                                      cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  // Library type defaults to value of BUILD_SHARED_LIBS, if it exists,
  // otherwise it defaults to static library.
  cmStateEnums::TargetType type = cmStateEnums::SHARED_LIBRARY;
  if (cmSystemTools::IsOff(
        this->Makefile->GetDefinition("BUILD_SHARED_LIBS"))) {
    type = cmStateEnums::STATIC_LIBRARY;
  }
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;

  std::vector<std::string>::const_iterator s = args.begin();

  std::string const& libName = *s;

  ++s;

  // If the second argument is "SHARED" or "STATIC", then it controls
  // the type of library.  Otherwise, it is treated as a source or
  // source list name. There may be two keyword arguments, check for them
  bool haveSpecifiedType = false;
  bool isAlias = false;
  while (s != args.end()) {
    std::string libType = *s;
    if (libType == "STATIC") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting STATIC type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::STATIC_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "SHARED") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting SHARED type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::SHARED_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "MODULE") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting MODULE type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::MODULE_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "OBJECT") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting OBJECT type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::OBJECT_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "UNKNOWN") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting UNKNOWN type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::UNKNOWN_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "ALIAS") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting ALIAS type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      isAlias = true;
    } else if (libType == "INTERFACE") {
      if (haveSpecifiedType) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting/multiple types.";
        this->SetError(e.str());
        return false;
      }
      if (isAlias) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting ALIAS type.";
        this->SetError(e.str());
        return false;
      }
      if (excludeFromAll) {
        std::ostringstream e;
        e << "INTERFACE library may not be used with EXCLUDE_FROM_ALL.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::INTERFACE_LIBRARY;
      haveSpecifiedType = true;
    } else if (*s == "EXCLUDE_FROM_ALL") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library may not be used with EXCLUDE_FROM_ALL.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      excludeFromAll = true;
    } else if (*s == "IMPORTED") {
      ++s;
      importTarget = true;
    } else if (importTarget && *s == "GLOBAL") {
      ++s;
      importGlobal = true;
    } else if (type == cmStateEnums::INTERFACE_LIBRARY && *s == "GLOBAL") {
      std::ostringstream e;
      e << "GLOBAL option may only be used with IMPORTED libraries.";
      this->SetError(e.str());
      return false;
    } else {
      break;
    }
  }

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    if (s != args.end()) {
      std::ostringstream e;
      e << "INTERFACE library requires no source arguments.";
      this->SetError(e.str());
      return false;
    }
    if (importGlobal && !importTarget) {
      std::ostringstream e;
      e << "INTERFACE library specified as GLOBAL, but not as IMPORTED.";
      this->SetError(e.str());
      return false;
    }
  }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(libName) &&
    !cmGlobalGenerator::IsReservedTarget(libName);

  if (nameOk && !importTarget && !isAlias) {
    nameOk = libName.find(':') == std::string::npos;
  }
  if (!nameOk) {
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    std::ostringstream e;
    bool issueMessage = false;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0037)) {
      case cmPolicies::WARN:
        if (type != cmStateEnums::INTERFACE_LIBRARY) {
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0037) << "\n";
          issueMessage = true;
        }
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = cmake::FATAL_ERROR;
    }
    if (issueMessage) {
      e << "The target name \"" << libName
        << "\" is reserved or not valid for certain "
           "CMake features, such as generator expressions, and may result "
           "in undefined behavior.";
      this->Makefile->IssueMessage(messageType, e.str());

      if (messageType == cmake::FATAL_ERROR) {
        return false;
      }
    }
  }

  if (isAlias) {
    if (!cmGeneratorExpression::IsValidTargetName(libName)) {
      this->SetError("Invalid name for ALIAS: " + libName);
      return false;
    }
    if (excludeFromAll) {
      this->SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
    }
    if (importTarget || importGlobal) {
      this->SetError("IMPORTED with ALIAS is not allowed.");
      return false;
    }
    if (args.size() != 3) {
      std::ostringstream e;
      e << "ALIAS requires exactly one target argument.";
      this->SetError(e.str());
      return false;
    }

    const char* aliasedName = s->c_str();
    if (this->Makefile->IsAlias(aliasedName)) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName << "\" is itself an ALIAS.";
      this->SetError(e.str());
      return false;
    }
    cmTarget* aliasedTarget =
      this->Makefile->FindTargetToUse(aliasedName, true);
    if (!aliasedTarget) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName << "\" does not already "
                          "exist.";
      this->SetError(e.str());
      return false;
    }
    cmStateEnums::TargetType aliasedType = aliasedTarget->GetType();
    if (aliasedType != cmStateEnums::SHARED_LIBRARY &&
        aliasedType != cmStateEnums::STATIC_LIBRARY &&
        aliasedType != cmStateEnums::MODULE_LIBRARY &&
        aliasedType != cmStateEnums::OBJECT_LIBRARY &&
        aliasedType != cmStateEnums::INTERFACE_LIBRARY) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName << "\" is not a library.";
      this->SetError(e.str());
      return false;
    }
    if (aliasedTarget->IsImported()) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName << "\" is IMPORTED.";
      this->SetError(e.str());
      return false;
    }
    this->Makefile->AddAlias(libName, aliasedName);
    return true;
  }

  if (importTarget && excludeFromAll) {
    this->SetError("excludeFromAll with IMPORTED target makes no sense.");
    return false;
  }

  /* ideally we should check whether for the linker language of the target
    CMAKE_${LANG}_CREATE_SHARED_LIBRARY is defined and if not default to
    STATIC. But at this point we know only the name of the target, but not
    yet its linker language. */
  if ((type == cmStateEnums::SHARED_LIBRARY ||
       type == cmStateEnums::MODULE_LIBRARY) &&
      !this->Makefile->GetState()->GetGlobalPropertyAsBool(
        "TARGET_SUPPORTS_SHARED_LIBS")) {
    std::ostringstream w;
    w << "ADD_LIBRARY called with "
      << (type == cmStateEnums::SHARED_LIBRARY ? "SHARED" : "MODULE")
      << " option but the target platform does not support dynamic linking. "
         "Building a STATIC library instead. This may lead to problems.";
    this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, w.str());
    type = cmStateEnums::STATIC_LIBRARY;
  }

  // Handle imported target creation.
  if (importTarget) {
    // The IMPORTED signature requires a type to be specified explicitly.
    if (!haveSpecifiedType) {
      this->SetError("called with IMPORTED argument but no library type.");
      return false;
    }
    if (type == cmStateEnums::OBJECT_LIBRARY) {
      std::string reason;
      if (!this->Makefile->GetGlobalGenerator()->HasKnownObjectFileLocation(
            &reason)) {
        this->Makefile->IssueMessage(
          cmake::FATAL_ERROR,
          "The OBJECT library type may not be used for IMPORTED libraries" +
            reason + ".");
        return true;
      }
    }
    if (type == cmStateEnums::INTERFACE_LIBRARY) {
      if (!cmGeneratorExpression::IsValidTargetName(libName)) {
        std::ostringstream e;
        e << "Invalid name for IMPORTED INTERFACE library target: " << libName;
        this->SetError(e.str());
        return false;
      }
    }

    // Make sure the target does not already exist.
    if (this->Makefile->FindTargetToUse(libName)) {
      std::ostringstream e;
      e << "cannot create imported target \"" << libName
        << "\" because another target with the same name already exists.";
      this->SetError(e.str());
      return false;
    }

    // Create the imported target.
    this->Makefile->AddImportedTarget(libName, type, importGlobal);
    return true;
  }

  // A non-imported target may not have UNKNOWN type.
  if (type == cmStateEnums::UNKNOWN_LIBRARY) {
    this->Makefile->IssueMessage(
      cmake::FATAL_ERROR,
      "The UNKNOWN library type may be used only for IMPORTED libraries.");
    return true;
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!this->Makefile->EnforceUniqueName(libName, msg)) {
      this->SetError(msg);
      return false;
    }
  }

  std::vector<std::string> srclists;

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    if (!cmGeneratorExpression::IsValidTargetName(libName) ||
        libName.find("::") != std::string::npos) {
      std::ostringstream e;
      e << "Invalid name for INTERFACE library target: " << libName;
      this->SetError(e.str());
      return false;
    }

    this->Makefile->AddLibrary(libName, type, srclists, excludeFromAll);
    return true;
  }

  if (s == args.end()) {
    std::string msg = "You have called ADD_LIBRARY for library ";
    msg += args[0];
    msg += " without any source files. This typically indicates a problem ";
    msg += "with your CMakeLists.txt file";
    cmSystemTools::Message(msg.c_str(), "Warning");
  }

  srclists.insert(srclists.end(), s, args.end());

  this->Makefile->AddLibrary(libName, type, srclists, excludeFromAll);

  return true;
}